

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.hpp
# Opt level: O1

void __thiscall
tf::
Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/taskflow_pipeline.cpp:65:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/taskflow_pipeline.cpp:75:36)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/examples/taskflow_pipeline.cpp:80:36)>_>
::_on_pipe(Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:65:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
           *this,Pipeflow *pf,Runtime *rt)

{
  size_t sVar1;
  Taskflow *target;
  Executor *this_00;
  
  sVar1 = pf->_pipe;
  if (sVar1 == 2) {
    this_00 = (this->_pipes).
              super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:65:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
              .
              super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
              .
              super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
              .
              super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>,_false>
              ._M_head_impl._callable.executor;
    target = (*(array<tf::Taskflow,_3UL> **)
               ((long)&(this->_pipes).
                       super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:65:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
                       .
                       super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
                       .
                       super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
                       .
                       super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>,_false>
                       ._M_head_impl._callable + 8))->_M_elems + 2;
  }
  else {
    if (sVar1 != 1) {
      if (sVar1 == 0) {
        if (pf->_token != 5) {
          printf("begin token %zu\n");
          this_00 = (this->_pipes).
                    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:65:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
                    .
                    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:65:36)>,_false>
                    ._M_head_impl._callable.executor;
          target = ((this->_pipes).
                    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:65:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
                    .
                    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:65:36)>,_false>
                    ._M_head_impl._callable.taskflows)->_M_elems + pf->_pipe;
          goto LAB_001069f0;
        }
        pf->_stop = true;
      }
      return;
    }
    this_00 = (this->_pipes).
              super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:65:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
              .
              super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
              .
              super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_false>
              ._M_head_impl._callable.executor;
    target = ((this->_pipes).
              super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:65:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
              .
              super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:80:36)>_>
              .
              super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_examples_taskflow_pipeline_cpp:75:36)>,_false>
              ._M_head_impl._callable.taskflows)->_M_elems + 1;
  }
LAB_001069f0:
  Executor::corun<tf::Taskflow>(this_00,target);
  return;
}

Assistant:

void Pipeline<Ps...>::_on_pipe(Pipeflow& pf, Runtime& rt) {
  visit_tuple([&](auto&& pipe){
    using callable_t = typename std::decay_t<decltype(pipe)>::callable_t;
    if constexpr (std::is_invocable_v<callable_t, Pipeflow&>) {
      pipe._callable(pf);
    }
    else if constexpr(std::is_invocable_v<callable_t, Pipeflow&, Runtime&>) {
      pipe._callable(pf, rt);
    }
    else {
      static_assert(dependent_false_v<callable_t>, "un-supported pipe callable type");
    }
  }, _pipes, pf._pipe);
}